

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

void __thiscall Gluco::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  Ref r;
  bool bVar1;
  int iVar2;
  uint *puVar3;
  Clause *c;
  long lVar4;
  long lVar5;
  long lVar6;
  vec<Gluco::Solver::Watcher> *pvVar7;
  ulong uVar8;
  ulong uVar9;
  
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::cleanAll
            (&this->watches);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::cleanAll
            (&this->watchesBin);
  this_00 = &this->ca;
  for (lVar4 = 0; lVar4 < (this->vardata).sz; lVar4 = lVar4 + 1) {
    for (uVar9 = 0; uVar9 != 2; uVar9 = uVar9 + 1) {
      uVar8 = uVar9 | lVar4 * 2;
      pvVar7 = (this->watches).occs.data + uVar8;
      lVar5 = 0;
      for (lVar6 = 0; lVar6 < pvVar7->sz; lVar6 = lVar6 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar7->data->cref + lVar5),to);
        lVar5 = lVar5 + 8;
      }
      pvVar7 = (this->watchesBin).occs.data + uVar8;
      lVar6 = 0;
      for (lVar5 = 0; lVar5 < pvVar7->sz; lVar5 = lVar5 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar7->data->cref + lVar6),to);
        lVar6 = lVar6 + 8;
      }
    }
  }
  lVar4 = 0;
  do {
    if ((this->trail).sz <= lVar4) {
      lVar5 = 0;
      for (lVar4 = 0; lVar4 < (this->learnts).sz; lVar4 = lVar4 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)(this->learnts).data + lVar5),to);
        lVar5 = lVar5 + 4;
      }
      lVar5 = 0;
      for (lVar4 = 0; lVar4 < (this->clauses).sz; lVar4 = lVar4 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)(this->clauses).data + lVar5),to);
        lVar5 = lVar5 + 4;
      }
      return;
    }
    iVar2 = (this->trail).data[lVar4].x >> 1;
    r = (this->vardata).data[iVar2].reason;
    if (r != 0xffffffff) {
      puVar3 = RegionAllocator<unsigned_int>::operator[]
                         (&this_00->super_RegionAllocator<unsigned_int>,r);
      if ((*puVar3 & 0x10) == 0) {
        c = (Clause *)
            RegionAllocator<unsigned_int>::operator[]
                      (&this_00->super_RegionAllocator<unsigned_int>,
                       (this->vardata).data[iVar2].reason);
        bVar1 = locked(this,c);
        if (!bVar1) goto LAB_004b7b80;
      }
      ClauseAllocator::reloc(this_00,&(this->vardata).data[iVar2].reason,to);
    }
LAB_004b7b80:
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    int v, s, i, j;
    // All watchers:
    //
    // for (int i = 0; i < watches.size(); i++)
    watches.cleanAll();
    watchesBin.cleanAll();
    for (v = 0; v < nVars(); v++)
        for (s = 0; s < 2; s++){
            Lit p = mkLit(v, s != 0);
            // printf(" >>> RELOCING: %s%d\n", sign(p)?"-":"", var(p)+1);
            vec<Watcher>& ws = watches[p];
            for (j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
            vec<Watcher>& ws2 = watchesBin[p];
            for (j = 0; j < ws2.size(); j++)
                ca.reloc(ws2[j].cref, to);
        }

    // All reasons:
    //
    for (i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)])))
            ca.reloc(vardata[v].reason, to);
    }

    // All learnt:
    //
    for (i = 0; i < learnts.size(); i++)
        ca.reloc(learnts[i], to);

    // All original:
    //
    for (i = 0; i < clauses.size(); i++)
        ca.reloc(clauses[i], to);
}